

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

bool __thiscall
glslang::TSymbolTableLevel::findFunctionVariableName
          (TSymbolTableLevel *this,TString *name,bool *variable)

{
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  bool bVar4;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>_>
          ::lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>_>
                         *)this,name);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->level)._M_t._M_impl.super__Rb_tree_header) {
LAB_0032c7e6:
    bVar1 = false;
  }
  else {
    this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (cVar3._M_node + 1);
    __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          find(this_00,'(',0);
    if (__n == 0xffffffffffffffff) {
      bVar1 = std::operator==(this_00,name);
      bVar4 = true;
      if (!bVar1) goto LAB_0032c7e6;
    }
    else {
      bVar4 = false;
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (this_00,0,__n,name);
      if (iVar2 != 0) {
        return false;
      }
    }
    *variable = bVar4;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool findFunctionVariableName(const TString& name, bool& variable) const
    {
        tLevel::const_iterator candidate = level.lower_bound(name);
        if (candidate != level.end()) {
            const TString& candidateName = (*candidate).first;
            TString::size_type parenAt = candidateName.find_first_of('(');
            if (parenAt == candidateName.npos) {
                // not a mangled name
                if (candidateName == name) {
                    // found a variable name match
                    variable = true;
                    return true;
                }
            } else {
                // a mangled name
                if (candidateName.compare(0, parenAt, name) == 0) {
                    // found a function name match
                    variable = false;
                    return true;
                }
            }
        }

        return false;
    }